

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(SupportVectorRegressor *a,SupportVectorRegressor *b)

{
  code *pcVar1;
  bool bVar2;
  SupportVectorsCase SVar3;
  SupportVectorsCase SVar4;
  Kernel *a_00;
  Kernel *b_00;
  Coefficients *a_01;
  Coefficients *b_01;
  SparseSupportVectors *pSVar5;
  RepeatedPtrField<CoreML::Specification::SparseVector> *a_02;
  RepeatedPtrField<CoreML::Specification::SparseVector> *b_02;
  DenseSupportVectors *pDVar6;
  RepeatedPtrField<CoreML::Specification::DenseVector> *a_03;
  RepeatedPtrField<CoreML::Specification::DenseVector> *b_03;
  double dVar7;
  double dVar8;
  SupportVectorRegressor *b_local;
  SupportVectorRegressor *a_local;
  
  a_00 = SupportVectorRegressor::kernel(a);
  b_00 = SupportVectorRegressor::kernel(b);
  bVar2 = operator!=(a_00,b_00);
  if (bVar2) {
    a_local._7_1_ = false;
  }
  else {
    SVar3 = SupportVectorRegressor::supportVectors_case(a);
    SVar4 = SupportVectorRegressor::supportVectors_case(b);
    if (SVar3 == SVar4) {
      a_01 = SupportVectorRegressor::coefficients(a);
      b_01 = SupportVectorRegressor::coefficients(b);
      bVar2 = operator!=(a_01,b_01);
      if (bVar2) {
        a_local._7_1_ = false;
      }
      else {
        dVar7 = SupportVectorRegressor::rho(a);
        dVar8 = SupportVectorRegressor::rho(b);
        if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
          a_local._7_1_ = false;
        }
        else {
          SVar3 = SupportVectorRegressor::supportVectors_case(a);
          if (SVar3 == SUPPORTVECTORS_NOT_SET) {
            a_local._7_1_ = false;
          }
          else if (SVar3 == kSparseSupportVectors) {
            pSVar5 = SupportVectorRegressor::sparsesupportvectors(a);
            a_02 = SparseSupportVectors::vectors(pSVar5);
            pSVar5 = SupportVectorRegressor::sparsesupportvectors(b);
            b_02 = SparseSupportVectors::vectors(pSVar5);
            a_local._7_1_ = operator==(a_02,b_02);
          }
          else {
            if (SVar3 != kDenseSupportVectors) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            pDVar6 = SupportVectorRegressor::densesupportvectors(a);
            a_03 = DenseSupportVectors::vectors(pDVar6);
            pDVar6 = SupportVectorRegressor::densesupportvectors(b);
            b_03 = DenseSupportVectors::vectors(pDVar6);
            a_local._7_1_ = operator==(a_03,b_03);
          }
        }
      }
    }
    else {
      a_local._7_1_ = false;
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const SupportVectorRegressor& a,
                        const SupportVectorRegressor& b) {
            if (a.kernel() != b.kernel()) {
                return false;
            }
            if (a.supportVectors_case() != b.supportVectors_case()) {
                return false;
            }
            if (a.coefficients() != b.coefficients()) {
                return false;
            }
            if (a.rho() != b.rho()) {
                return false;
            }
            switch (a.supportVectors_case()) {
                case SupportVectorRegressor::kSparseSupportVectors:
                    return a.sparsesupportvectors().vectors() == b.sparsesupportvectors().vectors();
                case SupportVectorRegressor::kDenseSupportVectors:
                    return a.densesupportvectors().vectors() == b.densesupportvectors().vectors();
                case SupportVectorRegressor::SUPPORTVECTORS_NOT_SET:
                    return false;
            }
        }